

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O1

list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *
Liby::Resolver::resolve
          (list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *__return_storage_ptr__,
          string *host,string *service)

{
  size_t *psVar1;
  addrinfo *info;
  int iVar2;
  _List_node_base *p_Var3;
  addrinfo *ailist;
  Endpoint local_48;
  addrinfo *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node._M_size = 0;
  iVar2 = getaddrinfo((host->_M_dataplus)._M_p,(service->_M_dataplus)._M_p,(addrinfo *)0x0,
                      (addrinfo **)&local_40);
  if (iVar2 == 0) {
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:102:28)>
               ::_M_invoke;
    local_38._8_8_ = 0;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:102:28)>
               ::_M_manager;
    for (info = local_40; info != (addrinfo *)0x0; info = info->ai_next) {
      Endpoint::Endpoint(&local_48,info);
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)local_48;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(__return_storage_ptr__->
                super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
    }
    DeferCaller::~DeferCaller((DeferCaller *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Endpoint> Resolver::resolve(const std::string &host,
                                      const std::string &service) {
    struct addrinfo *ailist;
    std::list<Endpoint> ret;

    int err = ::getaddrinfo(host.data(), service.data(), nullptr, &ailist);
    if (err != 0) {
        ; // throw err string
    } else {
        DeferCaller caller([ailist] { ::freeaddrinfo(ailist); });

        struct addrinfo *aip = ailist;
        for (; aip != NULL; aip = aip->ai_next) {
            ret.push_back(Endpoint(aip));
        }
    }
    return ret;
}